

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

int on_stream_open(quicly_stream_open_t *self,quicly_stream_t *stream)

{
  int iVar1;
  
  iVar1 = quicly_streambuf_create(stream,0x58);
  if (iVar1 == 0) {
    *(undefined8 *)((long)stream->data + 0x48) = 0xffffffffffffffff;
    stream->callbacks = &stream_callbacks;
    return 0;
  }
  __assert_fail("ret == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c"
                ,0x93,"int on_stream_open(quicly_stream_open_t *, quicly_stream_t *)");
}

Assistant:

static int on_stream_open(quicly_stream_open_t *self, quicly_stream_t *stream)
{
    test_streambuf_t *sbuf;
    int ret;

    ret = quicly_streambuf_create(stream, sizeof(*sbuf));
    assert(ret == 0);
    sbuf = stream->data;
    sbuf->error_received.stop_sending = -1;
    sbuf->error_received.reset_stream = -1;
    stream->callbacks = &stream_callbacks;

    return 0;
}